

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

String __thiscall testing::internal::StreamableToString<char*>(internal *this,char **streamable)

{
  ostream *in_RAX;
  size_t sVar1;
  size_t extraout_RDX;
  Message MVar3;
  char *__s;
  String SVar4;
  Message local_28;
  size_t sVar2;
  
  local_28.ss_ = (StrStream *)in_RAX;
  Message::Message(&local_28);
  __s = *streamable;
  if (__s == (char *)0x0) {
    MVar3.ss_ = local_28.ss_ + 0x10;
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    MVar3.ss_ = local_28.ss_;
    if (local_28.ss_ != (StrStream *)0x0) {
      MVar3.ss_ = (StrStream *)(local_28.ss_ + 0x10);
    }
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar3.ss_,__s,sVar1);
  SVar4 = StrStreamToString(this,local_28.ss_);
  sVar2 = SVar4.length_;
  if (local_28.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_28.ss_ + 8))();
    sVar2 = extraout_RDX;
  }
  SVar4.length_ = sVar2;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String StreamableToString(const T& streamable) {
  return (Message() << streamable).GetString();
}